

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void loadExt(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  sqlite3 *db_00;
  sqlite3 *pCtx;
  uchar *zFile_00;
  int in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  char *zProc;
  char *zFile;
  char *zErrMsg;
  char **in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = (sqlite3 *)sqlite3_value_text((sqlite3_value *)0x222c81);
  pCtx = sqlite3_context_db_handle(in_RDI);
  if ((pCtx->flags & 0x20000) == 0) {
    sqlite3_result_error((sqlite3_context *)pCtx,(char *)in_stack_ffffffffffffffb8,0);
  }
  else {
    if (in_ESI == 2) {
      zFile_00 = sqlite3_value_text((sqlite3_value *)0x222cef);
    }
    else {
      zFile_00 = (uchar *)0x0;
    }
    if (db_00 != (sqlite3 *)0x0) {
      iVar2 = sqlite3_load_extension(db_00,(char *)zFile_00,(char *)pCtx,in_stack_ffffffffffffffb8);
      if (iVar2 != 0) {
        sqlite3_result_error((sqlite3_context *)pCtx,(char *)in_stack_ffffffffffffffb8,0);
        sqlite3_free((void *)0x222d43);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void loadExt(sqlite3_context *context, int argc, sqlite3_value **argv){
  const char *zFile = (const char *)sqlite3_value_text(argv[0]);
  const char *zProc;
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zErrMsg = 0;

  /* Disallow the load_extension() SQL function unless the SQLITE_LoadExtFunc
  ** flag is set.  See the sqlite3_enable_load_extension() API.
  */
  if( (db->flags & SQLITE_LoadExtFunc)==0 ){
    sqlite3_result_error(context, "not authorized", -1);
    return;
  }

  if( argc==2 ){
    zProc = (const char *)sqlite3_value_text(argv[1]);
  }else{
    zProc = 0;
  }
  if( zFile && sqlite3_load_extension(db, zFile, zProc, &zErrMsg) ){
    sqlite3_result_error(context, zErrMsg, -1);
    sqlite3_free(zErrMsg);
  }
}